

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_getNextSeparatorTest_Test::TestBody
          (OpenDDLParserTest_getNextSeparatorTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_60;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  bool res;
  char *end;
  char *in;
  char tokenlist [8];
  OpenDDLParserTest_getNextSeparatorTest_Test *this_local;
  
  in = (char *)0x610a202c636261;
  gtest_ar_.message_.ptr_._7_1_ = 1;
  tokenlist = (char  [8])this;
  gtest_ar_.message_.ptr_._7_1_ = isSeparator<char>('a');
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_40,(bool)(~gtest_ar_.message_.ptr_._7_1_ & 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_40,(AssertionResult *)0x1a2175,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  pcVar2 = getNextSeparator<char>((char *)&in,(char *)((long)&in + 7));
  gtest_ar_.message_.ptr_._7_1_ = isSeparator<char>(*pcVar2);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_90,(bool)gtest_ar_.message_.ptr_._7_1_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_90,(AssertionResult *)0x1a2175,
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  pcVar2 = getNextSeparator<char>(pcVar2,(char *)((long)&in + 7));
  gtest_ar_.message_.ptr_._7_1_ = isSeparator<char>(*pcVar2);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_d0,(bool)gtest_ar_.message_.ptr_._7_1_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_d0,(AssertionResult *)0x1a2175,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, getNextSeparatorTest) {
    char tokenlist[] = "abc, \na";
    char *in(&tokenlist[0]);
    char *end(&tokenlist[strlen("abc, \na")]);

    bool res(true);
    res = isSeparator(*in);
    EXPECT_FALSE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
}